

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

uint16_t __thiscall
anon_unknown.dwarf_51ae1::CtorEvalExternalInterface::load16u
          (CtorEvalExternalInterface *this,Address addr,Name memoryName)

{
  unsigned_short uVar1;
  CtorEvalExternalInterface *this_local;
  Name memoryName_local;
  Address addr_local;
  
  uVar1 = doLoad<unsigned_short>(this,addr,memoryName);
  return uVar1;
}

Assistant:

uint16_t load16u(Address addr, Name memoryName) override {
    return doLoad<uint16_t>(addr, memoryName);
  }